

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx.h
# Opt level: O0

int gladLoadGLXUserPtr(Display *display,int screen,GLADuserptrloadfunc load,void *userptr)

{
  int iVar1;
  Display **in_RCX;
  code *in_RDX;
  int version;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  sf_glad_glXQueryVersion = (PFNGLXQUERYVERSIONPROC)(*in_RDX)(in_RCX,"glXQueryVersion");
  if (sf_glad_glXQueryVersion == (PFNGLXQUERYVERSIONPROC)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = glad_glx_find_core_glx
                        (in_RCX,(int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                        );
    glad_glx_load_GLX_VERSION_1_0
              ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
               (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    glad_glx_load_GLX_VERSION_1_1
              ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
               (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    glad_glx_load_GLX_VERSION_1_2
              ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
               (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    glad_glx_load_GLX_VERSION_1_3
              ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
               (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    glad_glx_load_GLX_VERSION_1_4
              ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
               (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    iVar1 = glad_glx_find_extensions
                      ((Display *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      glad_glx_load_GLX_ARB_create_context
                ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                 (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      glad_glx_load_GLX_EXT_swap_control
                ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                 (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      glad_glx_load_GLX_MESA_swap_control
                ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                 (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      glad_glx_load_GLX_SGIX_pbuffer
                ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                 (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      glad_glx_load_GLX_SGI_swap_control
                ((GLADuserptrloadfunc)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                 (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  return local_4;
}

Assistant:

static int gladLoadGLXUserPtr(Display *display, int screen, GLADuserptrloadfunc load, void *userptr) {
    int version;
    glXQueryVersion = (PFNGLXQUERYVERSIONPROC) load(userptr, "glXQueryVersion");
    if(glXQueryVersion == NULL) return 0;
    version = glad_glx_find_core_glx(&display, &screen);

    glad_glx_load_GLX_VERSION_1_0(load, userptr);
    glad_glx_load_GLX_VERSION_1_1(load, userptr);
    glad_glx_load_GLX_VERSION_1_2(load, userptr);
    glad_glx_load_GLX_VERSION_1_3(load, userptr);
    glad_glx_load_GLX_VERSION_1_4(load, userptr);

    if (!glad_glx_find_extensions(display, screen)) return 0;
    glad_glx_load_GLX_ARB_create_context(load, userptr);
    glad_glx_load_GLX_EXT_swap_control(load, userptr);
    glad_glx_load_GLX_MESA_swap_control(load, userptr);
    glad_glx_load_GLX_SGIX_pbuffer(load, userptr);
    glad_glx_load_GLX_SGI_swap_control(load, userptr);

    return version;
}